

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

bool __thiscall leveldb::anon_unknown_1::Limiter::Acquire(Limiter *this)

{
  int iVar1;
  bool bVar2;
  int old_acquires_allowed;
  Limiter *this_local;
  
  LOCK();
  iVar1 = (this->acquires_allowed_).super___atomic_base<int>._M_i;
  (this->acquires_allowed_).super___atomic_base<int>._M_i =
       (this->acquires_allowed_).super___atomic_base<int>._M_i + -1;
  UNLOCK();
  bVar2 = iVar1 < 1;
  if (bVar2) {
    LOCK();
    (this->acquires_allowed_).super___atomic_base<int>._M_i =
         (this->acquires_allowed_).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this_local._7_1_ = !bVar2;
  return this_local._7_1_;
}

Assistant:

bool Acquire() {
    int old_acquires_allowed =
        acquires_allowed_.fetch_sub(1, std::memory_order_relaxed);

    if (old_acquires_allowed > 0) return true;

    acquires_allowed_.fetch_add(1, std::memory_order_relaxed);
    return false;
  }